

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O2

bool __thiscall lzham::vector<unsigned_char>::append(vector<unsigned_char> *this,uchar *p,uint n)

{
  bool bVar1;
  
  if (n != 0) {
    bVar1 = insert(this,this->m_size,p,n);
    return bVar1;
  }
  return true;
}

Assistant:

bool append(const T* p, uint n)
      {
         if (n)
            return insert(m_size, p, n);
         return true;
      }